

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.hpp
# Opt level: O2

void __thiscall
helics::apps::AsioBrokerServer::AsioBrokerServer(AsioBrokerServer *this,string_view server_name)

{
  allocator<char> local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = server_name._M_str;
  local_30._M_len = server_name._M_len;
  (this->super_TypedBrokerServer)._vptr_TypedBrokerServer =
       (_func_int **)&PTR__AsioBrokerServer_004c02b8;
  memset(&this->tcpserver,0,0x88);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name_,&local_30,&local_31);
  this->tcp_enabled_ = false;
  this->udp_enabled_ = false;
  return;
}

Assistant:

explicit AsioBrokerServer(std::string_view server_name): name_(server_name) {}